

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::decDigits1(TokenStream *this,string *str_o)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  Stream<int> *in_RSI;
  long in_RDI;
  string str;
  bool ok;
  size_t in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 uVar5;
  undefined1 uVar6;
  string local_60 [39];
  byte local_39;
  
  local_39 = 0;
  std::__cxx11::string::string(local_60);
  while( true ) {
    puVar4 = (uint *)Stream<int>::peek(in_RSI);
    uVar1 = *puVar4;
    uVar5 = 0x2f < uVar1 && uVar1 < 0x3a;
    if (0x2f >= uVar1 || uVar1 >= 0x3a) break;
    local_39 = 1;
    in_stack_ffffffffffffff68 = *(size_t *)(in_RDI + 0x40);
    iVar3 = Stream<int>::get(in_RSI);
    std::__cxx11::string::operator+=(local_60,(char)iVar3);
  }
  if ((local_39 & 1) == 0) {
    uVar6 = uVar5;
    std::__cxx11::string::size();
    Stream<int>::unget((Stream<int> *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_ffffffffffffff70)),
                       in_stack_ffffffffffffff68);
  }
  else {
    std::__cxx11::string::operator+=((string *)in_RSI,local_60);
  }
  bVar2 = local_39;
  std::__cxx11::string::~string(local_60);
  return (bool)(bVar2 & 1);
}

Assistant:

bool TokenStream::decDigits1(std::string& str_o)
  {
    bool ok = false;
    std::string str;
    while (isDigit(cin->peek())) { ok = true; str += (char)cin->get(); }
    if (ok) str_o += str; else cin->unget(str.size());
    return ok;
  }